

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearbox.cpp
# Opt level: O1

void __thiscall chrono::ChShaftsGearbox::ChShaftsGearbox(ChShaftsGearbox *this)

{
  ChObj::ChObj((ChObj *)this);
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_ChPhysicsItem).cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_ChPhysicsItem).offset_w = 0;
  (this->super_ChPhysicsItem).offset_L = 0;
  (this->super_ChPhysicsItem).system = (ChSystem *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChPhysicsItem).vis_model_instance.
  super___shared_ptr<chrono::ChVisualModelInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChPhysicsItem).cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaftsGearbox_00b4a2a8
  ;
  this->r1 = 1.0;
  this->r2 = 1.0;
  this->r3 = 1.0;
  this->torque_react = 0.0;
  ChConstraintThreeGeneric::ChConstraintThreeGeneric(&this->constraint);
  this->shaft1 = (ChShaft *)0x0;
  this->shaft2 = (ChShaft *)0x0;
  this->body = (ChBodyFrame *)0x0;
  (this->shaft_dir).m_data[0] = VECT_X;
  (this->shaft_dir).m_data[1] = DAT_00b90ad8;
  (this->shaft_dir).m_data[2] = DAT_00b90ae0;
  this->r3 = 0.5;
  this->r1 = 0.5;
  this->r2 = -1.0;
  return;
}

Assistant:

ChShaftsGearbox::ChShaftsGearbox()
    : r1(1), r2(1), r3(1), torque_react(0), shaft1(NULL), shaft2(NULL), body(NULL), shaft_dir(VECT_X) {
    SetTransmissionRatio(0.5);
}